

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O2

int64_t GetFileSize(string *filename)

{
  int iVar1;
  int iVar2;
  char *fmt;
  uint64_t devsize;
  stat st;
  
  iVar1 = stat((filename->_M_dataplus)._M_p,(stat *)&st);
  if (iVar1 == 0) {
    if ((short)st.st_mode < 0) {
      return st.st_size;
    }
    if ((st.st_mode & 0x6000) == 0) {
      puts("could not get size for device");
      return -1;
    }
    iVar1 = open((filename->_M_dataplus)._M_p,0);
    iVar2 = ioctl(iVar1,0x80081272,&devsize);
    close(iVar1);
    if (iVar2 != -1) {
      return devsize;
    }
    fmt = "ERROR: ioctl(BLKGETSIZE64)";
  }
  else {
    fmt = "ERROR: stat";
  }
  print<>(fmt);
  return -1;
}

Assistant:

int64_t GetFileSize(const std::string& filename)
{
#ifdef WIN32
    HANDLE hSrc = CreateFile(filename.c_str(), GENERIC_READ, FILE_SHARE_WRITE|FILE_SHARE_READ,
                NULL, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, NULL);
    if (INVALID_HANDLE_VALUE == hSrc)
    {
        print("ERROR: Unable to open file %s", filename.c_str());
        return -1;
    }

    DWORD dwSizeH;
    DWORD dwSizeL= GetFileSize(hSrc, &dwSizeH);

    CloseHandle(hSrc);

    return ((int64_t)dwSizeH<<32)+dwSizeL;
#else
    struct stat st;
    if (stat(filename.c_str(), &st)) {
        print("ERROR: stat");
        return -1;
    }
    if (st.st_mode&S_IFREG)
        return st.st_size;
    else if (st.st_mode&S_IFBLK) {
        int h= open(filename.c_str(), O_RDONLY);
        uint64_t devsize;
#ifdef DKIOCGETBLOCKCOUNT
        uint64_t bkcount;
        uint32_t bksize;
        if (-1==ioctl(h, DKIOCGETBLOCKCOUNT, &bkcount)) {
            close(h);
            print("ERROR: ioctl(DKIOCGETBLOCKCOUNT)");
            return -1;
        }
        if (-1==ioctl(h, DKIOCGETBLOCKSIZE, &bksize)) {
            close(h);
            print("ERROR: ioctl(DKIOCGETBLOCKSIZE)");
            return -1;
        }
        devsize = bkcount*bksize;
#endif
#ifdef BLKGETSIZE64
        if (-1==ioctl(h, BLKGETSIZE64, &devsize)) {
            close(h);
            print("ERROR: ioctl(BLKGETSIZE64)");
            return -1;
        }
#endif
        close(h);
        return devsize;
    }
    else {
        printf("could not get size for device\n");
        return -1;
    }
#endif
}